

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::operator==
          (Entity_Damage_Status_PDU *this,Entity_Damage_Status_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  StandardVariable **ppSVar5;
  bool bVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((!KVar3) &&
      (KVar3 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_DmgEnt,&Value->m_DmgEnt), !KVar3))
     && (this->m_ui16NumDmgDescRecs == Value->m_ui16NumDmgDescRecs)) {
    pKVar1 = (this->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar4 = (Value->m_vDdRec).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vDdRec).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppSVar5 = &pKVar4->m_pRef;
      do {
        pKVar4 = pKVar1 + 1;
        bVar6 = pKVar1->m_pRef == *ppSVar5;
        if (!bVar6) {
          return bVar6;
        }
        ppSVar5 = ppSVar5 + 3;
        pKVar1 = pKVar4;
      } while (pKVar4 != pKVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

KBOOL Entity_Damage_Status_PDU::operator == ( const Entity_Damage_Status_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_DmgEnt             != Value.m_DmgEnt )             return false;
    if( m_ui16NumDmgDescRecs != Value.m_ui16NumDmgDescRecs ) return false;
    if( m_vDdRec             != Value.m_vDdRec )             return false;
    return true;
}